

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

string * efsw::FileSystem::fileNameFromPath(string *__return_storage_ptr__,string *filepath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char cVar4;
  long lVar5;
  
  dirRemoveSlashAtEnd(filepath);
  cVar4 = Platform::FileSystem::getOSSlash();
  lVar5 = std::__cxx11::string::rfind((char)filepath,(ulong)(uint)(int)cVar4);
  if (lVar5 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (filepath->_M_dataplus)._M_p;
    paVar1 = &filepath->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&filepath->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = filepath->_M_string_length;
    (filepath->_M_dataplus)._M_p = (pointer)paVar1;
    filepath->_M_string_length = 0;
    (filepath->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileSystem::fileNameFromPath( std::string filepath )
{
	dirRemoveSlashAtEnd( filepath );

	size_t pos = filepath.find_last_of( getOSSlash() );

	if ( pos != std::string::npos )
	{
		return filepath.substr( pos + 1 );
	}

	return filepath;
}